

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_SetInnerForcing
              (void *arkode_mem,realtype tshift,realtype tscale,N_Vector *forcing,int nvecs)

{
  int iVar1;
  void *pvVar2;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  
  iVar1 = arkStep_AccessStepMem
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (ARKodeARKStepMem *)0x112d579);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (in_EDX < 1) {
    in_stack_ffffffffffffffc0[0x1ac] = '\0';
    in_stack_ffffffffffffffc0[0x1ad] = '\0';
    in_stack_ffffffffffffffc0[0x1ae] = '\0';
    in_stack_ffffffffffffffc0[0x1af] = '\0';
    in_stack_ffffffffffffffc0[0x1b0] = '\0';
    in_stack_ffffffffffffffc0[0x1b1] = '\0';
    in_stack_ffffffffffffffc0[0x1b2] = '\0';
    in_stack_ffffffffffffffc0[0x1b3] = '\0';
    in_stack_ffffffffffffffc0[0x1b8] = '\0';
    in_stack_ffffffffffffffc0[0x1b9] = '\0';
    in_stack_ffffffffffffffc0[0x1ba] = '\0';
    in_stack_ffffffffffffffc0[0x1bb] = '\0';
    in_stack_ffffffffffffffc0[0x1bc] = '\0';
    in_stack_ffffffffffffffc0[0x1bd] = '\0';
    in_stack_ffffffffffffffc0[0x1be] = '\0';
    in_stack_ffffffffffffffc0[0x1bf] = '\0';
    in_stack_ffffffffffffffc0[0x1c0] = '\0';
    in_stack_ffffffffffffffc0[0x1c1] = '\0';
    in_stack_ffffffffffffffc0[0x1c2] = '\0';
    in_stack_ffffffffffffffc0[0x1c3] = '\0';
    in_stack_ffffffffffffffc0[0x1c4] = '\0';
    in_stack_ffffffffffffffc0[0x1c5] = '\0';
    in_stack_ffffffffffffffc0[0x1c6] = -0x10;
    in_stack_ffffffffffffffc0[0x1c7] = '?';
    in_stack_ffffffffffffffc0[0x1c8] = '\0';
    in_stack_ffffffffffffffc0[0x1c9] = '\0';
    in_stack_ffffffffffffffc0[0x1ca] = '\0';
    in_stack_ffffffffffffffc0[0x1cb] = '\0';
    in_stack_ffffffffffffffc0[0x1cc] = '\0';
    in_stack_ffffffffffffffc0[0x1cd] = '\0';
    in_stack_ffffffffffffffc0[0x1ce] = '\0';
    in_stack_ffffffffffffffc0[0x1cf] = '\0';
    in_stack_ffffffffffffffc0[0x1d0] = '\0';
    in_stack_ffffffffffffffc0[0x1d1] = '\0';
    in_stack_ffffffffffffffc0[0x1d2] = '\0';
    in_stack_ffffffffffffffc0[0x1d3] = '\0';
  }
  else {
    if (*(int *)(in_stack_ffffffffffffffc0 + 0x18) == 0) {
      in_stack_ffffffffffffffc0[0x1ac] = '\0';
      in_stack_ffffffffffffffc0[0x1ad] = '\0';
      in_stack_ffffffffffffffc0[0x1ae] = '\0';
      in_stack_ffffffffffffffc0[0x1af] = '\0';
      in_stack_ffffffffffffffc0[0x1b0] = '\x01';
      in_stack_ffffffffffffffc0[0x1b1] = '\0';
      in_stack_ffffffffffffffc0[0x1b2] = '\0';
      in_stack_ffffffffffffffc0[0x1b3] = '\0';
    }
    else {
      in_stack_ffffffffffffffc0[0x1ac] = '\x01';
      in_stack_ffffffffffffffc0[0x1ad] = '\0';
      in_stack_ffffffffffffffc0[0x1ae] = '\0';
      in_stack_ffffffffffffffc0[0x1af] = '\0';
      in_stack_ffffffffffffffc0[0x1b0] = '\0';
      in_stack_ffffffffffffffc0[0x1b1] = '\0';
      in_stack_ffffffffffffffc0[0x1b2] = '\0';
      in_stack_ffffffffffffffc0[0x1b3] = '\0';
    }
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x1b8) = in_XMM0_Qa;
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x1c0) = in_XMM1_Qa;
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x1c8) = in_RSI;
    *(int *)(in_stack_ffffffffffffffc0 + 0x1d0) = in_EDX;
    if (((*(long *)(in_stack_ffffffffffffffc0 + 0x198) != 0) &&
        (*(long *)(in_stack_ffffffffffffffc0 + 0x1a0) != 0)) &&
       (*(int *)(in_stack_ffffffffffffffc0 + 0x1a8) - in_EDX <
        *(int *)(in_stack_ffffffffffffffc0 + 0x5c) * 2 + 2)) {
      if (*(long *)(in_stack_ffffffffffffffc0 + 0x198) != 0) {
        free(*(void **)(in_stack_ffffffffffffffc0 + 0x198));
        *(long *)((long)in_stack_ffffffffffffffc8 + 0x218) =
             *(long *)((long)in_stack_ffffffffffffffc8 + 0x218) -
             (long)*(int *)(in_stack_ffffffffffffffc0 + 0x1a8);
      }
      if (*(long *)(in_stack_ffffffffffffffc0 + 0x1a0) != 0) {
        free(*(void **)(in_stack_ffffffffffffffc0 + 0x1a0));
        *(long *)((long)in_stack_ffffffffffffffc8 + 0x220) =
             *(long *)((long)in_stack_ffffffffffffffc8 + 0x220) -
             (long)*(int *)(in_stack_ffffffffffffffc0 + 0x1a8);
      }
      *(int *)(in_stack_ffffffffffffffc0 + 0x1a8) =
           *(int *)(in_stack_ffffffffffffffc0 + 0x5c) * 2 + 2 + in_EDX;
      in_stack_ffffffffffffffc0[0x198] = '\0';
      in_stack_ffffffffffffffc0[0x199] = '\0';
      in_stack_ffffffffffffffc0[0x19a] = '\0';
      in_stack_ffffffffffffffc0[0x19b] = '\0';
      in_stack_ffffffffffffffc0[0x19c] = '\0';
      in_stack_ffffffffffffffc0[0x19d] = '\0';
      in_stack_ffffffffffffffc0[0x19e] = '\0';
      in_stack_ffffffffffffffc0[0x19f] = '\0';
      pvVar2 = calloc((long)*(int *)(in_stack_ffffffffffffffc0 + 0x1a8),8);
      *(void **)(in_stack_ffffffffffffffc0 + 0x198) = pvVar2;
      if (*(long *)(in_stack_ffffffffffffffc0 + 0x198) == 0) {
        return -0x14;
      }
      *(long *)((long)in_stack_ffffffffffffffc8 + 0x218) =
           (long)*(int *)(in_stack_ffffffffffffffc0 + 0x1a8) +
           *(long *)((long)in_stack_ffffffffffffffc8 + 0x218);
      in_stack_ffffffffffffffc0[0x1a0] = '\0';
      in_stack_ffffffffffffffc0[0x1a1] = '\0';
      in_stack_ffffffffffffffc0[0x1a2] = '\0';
      in_stack_ffffffffffffffc0[0x1a3] = '\0';
      in_stack_ffffffffffffffc0[0x1a4] = '\0';
      in_stack_ffffffffffffffc0[0x1a5] = '\0';
      in_stack_ffffffffffffffc0[0x1a6] = '\0';
      in_stack_ffffffffffffffc0[0x1a7] = '\0';
      pvVar2 = calloc((long)*(int *)(in_stack_ffffffffffffffc0 + 0x1a8),8);
      *(void **)(in_stack_ffffffffffffffc0 + 0x1a0) = pvVar2;
      if (*(long *)(in_stack_ffffffffffffffc0 + 0x1a0) == 0) {
        return -0x14;
      }
      *(long *)((long)in_stack_ffffffffffffffc8 + 0x220) =
           (long)*(int *)(in_stack_ffffffffffffffc0 + 0x1a8) +
           *(long *)((long)in_stack_ffffffffffffffc8 + 0x220);
    }
  }
  return 0;
}

Assistant:

int arkStep_SetInnerForcing(void* arkode_mem, realtype tshift, realtype tscale,
                            N_Vector* forcing, int nvecs)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_SetInnerForcing",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  if (nvecs > 0) {

    /* enable forcing */
    if (step_mem->explicit) {
      step_mem->expforcing = SUNTRUE;
      step_mem->impforcing = SUNFALSE;
    } else {
      step_mem->expforcing = SUNFALSE;
      step_mem->impforcing = SUNTRUE;
    }
    step_mem->tshift   = tshift;
    step_mem->tscale   = tscale;
    step_mem->forcing  = forcing;
    step_mem->nforcing = nvecs;

    /* If cvals and Xvecs are not allocated then arkStep_Init has not been
       called and the number of stages has not been set yet. These arrays will
       be allocated in arkStep_Init and take into account the value of nforcing.
       On subsequent calls will check if enough space has allocated in case
       nforcing has increased since the original allocation. */
    if (step_mem->cvals != NULL && step_mem->Xvecs != NULL) {

      /* check if there are enough reusable arrays for fused operations */
      if ((step_mem->nfusedopvecs - nvecs) < (2 * step_mem->stages + 2)) {

        /* free current work space */
        if (step_mem->cvals != NULL) {
          free(step_mem->cvals);
          ark_mem->lrw -= step_mem->nfusedopvecs;
        }
        if (step_mem->Xvecs != NULL) {
          free(step_mem->Xvecs);
          ark_mem->liw -= step_mem->nfusedopvecs;
        }

        /* allocate reusable arrays for fused vector operations */
        step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + nvecs;

        step_mem->cvals = NULL;
        step_mem->cvals = (realtype *) calloc(step_mem->nfusedopvecs,
                                              sizeof(realtype));
        if (step_mem->cvals == NULL) return(ARK_MEM_FAIL);
        ark_mem->lrw += step_mem->nfusedopvecs;

        step_mem->Xvecs = NULL;
        step_mem->Xvecs = (N_Vector *) calloc(step_mem->nfusedopvecs,
                                              sizeof(N_Vector));
        if (step_mem->Xvecs == NULL) return(ARK_MEM_FAIL);
        ark_mem->liw += step_mem->nfusedopvecs;
      }
    }

  } else {

    /* disable forcing */
    step_mem->expforcing = SUNFALSE;
    step_mem->impforcing = SUNFALSE;
    step_mem->tshift     = ZERO;
    step_mem->tscale     = ONE;
    step_mem->forcing    = NULL;
    step_mem->nforcing   = 0;

  }

  return(0);
}